

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtablez_sampler.cc
# Opt level: O0

HashtablezSampler * absl::lts_20240722::container_internal::GlobalHashtablezSampler(void)

{
  int iVar1;
  SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *pSVar2;
  
  if (GlobalHashtablezSampler()::sampler == '\0') {
    iVar1 = __cxa_guard_acquire(&GlobalHashtablezSampler()::sampler);
    if (iVar1 != 0) {
      NoDestructor<absl::lts_20240722::profiling_internal::SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo>_>
      ::NoDestructor<0>(&GlobalHashtablezSampler::sampler);
      __cxa_guard_release(&GlobalHashtablezSampler()::sampler);
    }
  }
  pSVar2 = NoDestructor<absl::lts_20240722::profiling_internal::SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo>_>
           ::operator*(&GlobalHashtablezSampler::sampler);
  return pSVar2;
}

Assistant:

HashtablezSampler& GlobalHashtablezSampler() {
  static absl::NoDestructor<HashtablezSampler> sampler;
  return *sampler;
}